

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuEvent>::erase
          (QMovableArrayOps<QDBusMenuEvent> *this,QDBusMenuEvent *b,qsizetype n)

{
  QDBusMenuEvent *pQVar1;
  long lVar2;
  QDBusMenuEvent *pQVar3;
  QDBusMenuEvent *__last;
  
  __last = b + n;
  std::_Destroy_aux<false>::__destroy<QDBusMenuEvent*>(b,__last);
  pQVar1 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
           ptr;
  lVar2 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.
          size;
  pQVar3 = pQVar1 + lVar2;
  if (__last == pQVar3 || pQVar1 != b) {
    if (__last != pQVar3) {
      memmove(b,__last,(long)pQVar3 - (long)__last);
      lVar2 = (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>
              .size;
    }
  }
  else {
    (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.ptr =
         __last;
  }
  (this->super_QGenericArrayOps<QDBusMenuEvent>).super_QArrayDataPointer<QDBusMenuEvent>.size =
       lVar2 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }